

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> * __thiscall
libtorrent::http_parser::header_duration
          (optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> *__return_storage_ptr__,
          http_parser *this,string_view key)

{
  bool bVar1;
  char *__nptr;
  duration<int,_std::ratio<1L,_1L>_> local_88 [2];
  long local_80;
  long val;
  _Self local_70 [3];
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Self local_30;
  const_iterator i;
  http_parser *this_local;
  string_view key_local;
  
  key_local.ptr_ = (char *)key.len_;
  this_local = (http_parser *)key.ptr_;
  i._M_node = (_Base_ptr)this;
  key_local.len_ = (size_t)__return_storage_ptr__;
  std::allocator<char>::allocator();
  boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
            (&local_50,(basic_string_view<char,std::char_traits<char>> *)&this_local,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->m_header,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->m_header);
  bVar1 = std::operator==(&local_30,local_70);
  if (bVar1) {
    boost::optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>::optional
              (__return_storage_ptr__);
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_30);
    __nptr = (char *)std::__cxx11::string::c_str();
    local_80 = atol(__nptr);
    if (local_80 < 1) {
      boost::optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>::optional
                (__return_storage_ptr__);
    }
    else {
      std::chrono::duration<int,std::ratio<1l,1l>>::duration<long,void>
                ((duration<int,std::ratio<1l,1l>> *)local_88,&local_80);
      boost::optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>::optional
                (__return_storage_ptr__,local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<seconds32> http_parser::header_duration(string_view const key) const
	{
		// TODO: remove to_string() if we're in C++14
		auto const i = m_header.find(key.to_string());
		if (i == m_header.end()) return boost::none;
		auto const val = std::atol(i->second.c_str());
		if (val <= 0) return boost::none;
		return seconds32(val);
	}